

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

string * ghc::filesystem::detail::systemErrorText<int>(int code)

{
  int *piVar1;
  char *pcVar2;
  int in_ESI;
  string *in_RDI;
  char buffer [512];
  int local_244;
  allocator local_219;
  char local_218 [536];
  
  local_244 = in_ESI;
  if (in_ESI == 0) {
    piVar1 = __errno_location();
    local_244 = *piVar1;
  }
  pcVar2 = strerror_r(local_244,local_218,0x200);
  pcVar2 = strerror_adapter(pcVar2,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar2,&local_219);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  return in_RDI;
}

Assistant:

GHC_INLINE std::string systemErrorText(ErrorNumber code = 0)
{
#if defined(GHC_OS_WINDOWS)
    LPVOID msgBuf;
    DWORD dw = code ? static_cast<DWORD>(code) : ::GetLastError();
    FormatMessageW(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS, NULL, dw, MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPWSTR)&msgBuf, 0, NULL);
    std::string msg = toUtf8(std::wstring((LPWSTR)msgBuf));
    LocalFree(msgBuf);
    return msg;
#else
    char buffer[512];
    return strerror_adapter(strerror_r(code ? code : errno, buffer, sizeof(buffer)), buffer);
#endif
}